

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 703_kthLargestElement.cpp
# Opt level: O1

int __thiscall KthLargest::add(KthLargest *this,int val)

{
  priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_> *this_00;
  int *piVar1;
  int local_c;
  
  this_00 = &this->pq;
  piVar1 = (this->pq).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c = val;
  if ((ulong)((long)(this->pq).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2) < (ulong)(long)this->k) {
    std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::push
              (this_00,&local_c);
  }
  else if (*piVar1 < val) {
    std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::push
              (this_00,&local_c);
    std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::pop
              (this_00);
  }
  return *(this_00->c).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start;
}

Assistant:

int add(int val) {
        if (pq.size()<k)
            pq.push(val);
        else if (val>pq.top())
        {
            pq.push(val);
            pq.pop();
        }
        return pq.top();
    }